

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswSim.c
# Opt level: O2

void Ssw_SmlUnnormalize(Ssw_Sml_t *p)

{
  uint *puVar1;
  int iVar2;
  int iVar3;
  Vec_Ptr_t *p_00;
  ulong uVar4;
  void *pvVar5;
  ulong uVar6;
  long lVar7;
  int i;
  
  uVar6 = 0;
  uVar4 = (ulong)(uint)p->nWordsFrame;
  if (p->nWordsFrame < 1) {
    uVar4 = uVar6;
  }
  for (; uVar4 != uVar6; uVar6 = uVar6 + 1) {
    puVar1 = (uint *)((long)&p[1].pAig + uVar6 * 4);
    *puVar1 = ~*puVar1;
  }
  for (i = 0; p_00 = p->pAig->vObjs, i < p_00->nSize; i = i + 1) {
    pvVar5 = Vec_PtrEntry(p_00,i);
    if (((pvVar5 != (void *)0x0) && ((*(ulong *)((long)pvVar5 + 0x18) & 8) != 0)) &&
       (0xfffffffd < ((uint)*(ulong *)((long)pvVar5 + 0x18) & 7) - 7)) {
      iVar2 = p->nWordsTotal;
      iVar3 = *(int *)((long)pvVar5 + 0x24);
      for (lVar7 = 0; lVar7 < p->nWordsFrame; lVar7 = lVar7 + 1) {
        puVar1 = (uint *)((long)&p[1].pAig + lVar7 * 4 + (long)(iVar2 * iVar3) * 4);
        *puVar1 = ~*puVar1;
      }
    }
  }
  return;
}

Assistant:

void Ssw_SmlUnnormalize( Ssw_Sml_t * p )
{
    Aig_Obj_t * pObj;
    unsigned * pSims;
    int i, k;
    // convert constant 1
    pSims  = Ssw_ObjSim( p, 0 );
    for ( i = 0; i < p->nWordsFrame; i++ )
        pSims[i] = ~pSims[i];
    // convert internal nodes
    Aig_ManForEachNode( p->pAig, pObj, k )
    {
        if ( pObj->fPhase == 0 )
            continue;
        pSims  = Ssw_ObjSim( p, pObj->Id );
        for ( i = 0; i < p->nWordsFrame; i++ )
            pSims[i] = ~pSims[i];
    }
    // PIs/POs are always stored in their natural state
}